

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

string * __thiscall
pbrt::RealisticCamera::LensElementInterface::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LensElementInterface *this)

{
  float *unaff_RBX;
  
  StringPrintf<float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ LensElementInterface curvatureRadius: %f thickness: %f eta: %f apertureRadius: %f ]"
             ,(char *)this,&this->thickness,&this->eta,&this->apertureRadius,unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string RealisticCamera::LensElementInterface::ToString() const {
    return StringPrintf("[ LensElementInterface curvatureRadius: %f thickness: %f "
                        "eta: %f apertureRadius: %f ]",
                        curvatureRadius, thickness, eta, apertureRadius);
}